

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O2

void gmlc::utilities::stringOps::splitline
               (string_view line,stringVector *strVec,string_view delimiters,
               delimiter_compression compression)

{
  basic_string_view<char,_std::char_traits<char>_> local_48;
  size_t local_38;
  char *local_30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  local_30 = line._M_str;
  local_38 = line._M_len;
  local_48._M_str = delimiters._M_str;
  local_48._M_len = delimiters._M_len;
  generalized_string_split<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
            (&local_28,(utilities *)&local_38,&local_48,
             (basic_string_view<char,_std::char_traits<char>_> *)(ulong)(compression == on),
             delimiters._M_str._0_1_);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(strVec,&local_28);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_28);
  return;
}

Assistant:

void splitline(
        std::string_view line,
        stringVector& strVec,
        std::string_view delimiters,
        delimiter_compression compression)
    {
        strVec = generalized_string_split<std::string_view, std::string>(
            line, delimiters, (compression == delimiter_compression::on));
    }